

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadBodyForce::ComputeQ(ChLoadBodyForce *this,ChState *state_x,ChStateDelta *state_w)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  undefined1 auVar9 [16];
  int iVar10;
  long *plVar11;
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVectorDynamic<> mF;
  double detJ;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double *local_48;
  double dStack_40;
  undefined1 local_30 [8];
  
  peVar8 = (this->super_ChLoadCustom).loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar8 == (element_type *)0x0) {
LAB_005c8112:
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)__dynamic_cast(peVar8,&ChLoadable::typeinfo,&ChBody::typeinfo,
                                     0xffffffffffffffff);
    if (plVar11 == (long *)0x0) goto LAB_005c8112;
    this_00 = (this->super_ChLoadCustom).loadable.
              super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar12 = (**(code **)(*plVar11 + 0x1e0))(plVar11);
  if (*(char *)(lVar12 + 0x2c) == '\0') {
    if (this->m_local_force == true) {
      dVar1 = (this->m_force).m_data[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (this->m_force).m_data[0];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (this->m_force).m_data[2];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = plVar11[0x17];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1 * (double)plVar11[0x18];
      auVar2 = vfmadd231sd_fma(auVar16,auVar13,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = plVar11[0x1a];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar1 * (double)plVar11[0x1b];
      auVar3 = vfmadd231sd_fma(auVar17,auVar13,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = plVar11[0x1d];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar1 * (double)plVar11[0x1e];
      auVar4 = vfmadd231sd_fma(auVar14,auVar13,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = plVar11[0x19];
      auVar2 = vfmadd231sd_fma(auVar2,auVar15,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = plVar11[0x1c];
      auVar3 = vfmadd231sd_fma(auVar3,auVar15,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = plVar11[0x1f];
      auVar4 = vfmadd231sd_fma(auVar4,auVar15,auVar7);
      local_68 = auVar4._0_8_;
      local_58 = auVar2._0_8_;
      local_60 = auVar3._0_8_;
    }
    else {
      local_58 = (this->m_force).m_data[0];
      local_60 = (this->m_force).m_data[1];
      local_68 = (this->m_force).m_data[2];
    }
    local_50 = this->m_scale;
    if (this->m_local_point == true) {
      ChTransform<double>::TransformLocalToParent
                (&this->m_point,(ChVector<double> *)(plVar11 + 0x10),
                 (ChMatrix33<double> *)(plVar11 + 0x17));
      local_48 = local_88.m_storage.m_data;
      dStack_40 = (double)local_88.m_storage.m_rows;
    }
    else {
      local_48 = (double *)(this->m_point).m_data[0];
      dStack_40 = (this->m_point).m_data[1];
      local_78 = (this->m_point).m_data[2];
    }
    local_70 = local_78;
    iVar10 = (*((this->super_ChLoadCustom).loadable.
                super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_ChLoadable[7])();
    local_88.m_storage.m_data = (double *)0x0;
    local_88.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,(long)iVar10);
    if (0 < local_88.m_storage.m_rows) {
      *local_88.m_storage.m_data = local_50 * local_58;
      if (((((double)local_88.m_storage.m_rows != 4.94065645841247e-324) &&
           (local_88.m_storage.m_data[1] = local_50 * local_60, 2 < (ulong)local_88.m_storage.m_rows
           )) && (local_88.m_storage.m_data[2] = local_50 * local_68,
                 (double)local_88.m_storage.m_rows != 1.48219693752374e-323)) &&
         ((local_88.m_storage.m_data[3] = 0.0, 4 < (ulong)local_88.m_storage.m_rows &&
          (local_88.m_storage.m_data[4] = 0.0,
          (double)local_88.m_storage.m_rows != 2.47032822920623e-323)))) {
        auVar9._8_8_ = dStack_40;
        auVar9._0_8_ = local_48;
        local_88.m_storage.m_data[5] = 0.0;
        auVar2 = vshufpd_avx(auVar9,auVar9,1);
        (**(code **)(*plVar11 + 0x220))
                  (local_48,auVar2._0_8_,local_70,plVar11,&(this->super_ChLoadCustom).load_Q,
                   local_30,&local_88,state_x,state_w);
        if (local_88.m_storage.m_data != (double *)0x0) {
          free((void *)local_88.m_storage.m_data[-1]);
        }
        goto LAB_005c831b;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_005c831b:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void ChLoadBodyForce::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mbody = std::dynamic_pointer_cast<ChBody>(this->loadable);
    if (!mbody->Variables().IsActive())
        return;

    ChVector<> abs_force;
    if (m_local_force)
        abs_force = mbody->TransformDirectionLocalToParent(m_force);
    else
        abs_force = m_force;

    abs_force *= m_scale;

    ChVector<> abs_point;
    if (m_local_point)
        abs_point = mbody->TransformPointLocalToParent(m_point);
    else
        abs_point = m_point;

    // ChBody assumes F={force_abs, torque_abs}
    ChVectorDynamic<> mF(loadable->Get_field_ncoords());
    mF(0) = abs_force.x();
    mF(1) = abs_force.y();
    mF(2) = abs_force.z();
    mF(3) = 0;
    mF(4) = 0;
    mF(5) = 0;

    // Compute Q = N(u,v,w)'*F
    double detJ;  // not used
    mbody->ComputeNF(abs_point.x(), abs_point.y(), abs_point.z(), load_Q, detJ, mF, state_x, state_w);
}